

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

size_t aead_encrypt(st_ptls_traffic_protection_t *ctx,void *output,void *input,size_t inlen,
                   uint8_t content_type)

{
  st_ptls_aead_context_t *psVar1;
  ulong uVar2;
  size_t sVar3;
  size_t sVar4;
  long lVar5;
  size_t sVar6;
  uint8_t aad [5];
  uint8_t iv [16];
  uint8_t local_56;
  undefined2 local_55;
  undefined1 local_53;
  undefined1 local_52;
  undefined1 local_51;
  void *local_50;
  undefined1 local_48 [24];
  
  psVar1 = ctx->aead;
  lVar5 = inlen + 1 + psVar1->algo->tag_size;
  local_55 = 0x317;
  local_53 = 3;
  local_52 = (undefined1)((ulong)lVar5 >> 8);
  local_51 = (undefined1)lVar5;
  uVar2 = ctx->seq;
  ctx->seq = uVar2 + 1;
  sVar6 = psVar1->algo->iv_size;
  local_56 = content_type;
  local_50 = input;
  if (sVar6 - 8 != 0) {
    memcpy(local_48,psVar1->static_iv,sVar6 - 8);
  }
  lVar5 = 0x38;
  do {
    local_48[sVar6 - 8] = (byte)(uVar2 >> ((byte)lVar5 & 0x3f)) ^ psVar1->static_iv[sVar6 - 8];
    lVar5 = lVar5 + -8;
    sVar6 = sVar6 + 1;
  } while (lVar5 != -8);
  (*psVar1->do_encrypt_init)(psVar1,local_48,&local_55,5);
  sVar6 = (*ctx->aead->do_encrypt_update)(ctx->aead,output,local_50,inlen);
  sVar3 = (*ctx->aead->do_encrypt_update)(ctx->aead,(void *)((long)output + sVar6),&local_56,1);
  sVar4 = (*ctx->aead->do_encrypt_final)(ctx->aead,(void *)((long)output + sVar3 + sVar6));
  return sVar4 + sVar3 + sVar6;
}

Assistant:

static size_t aead_encrypt(struct st_ptls_traffic_protection_t *ctx, void *output, const void *input, size_t inlen,
                           uint8_t content_type)
{
    uint8_t aad[5];
    size_t off = 0;

    build_aad(aad, inlen + 1 + ctx->aead->algo->tag_size);
    ptls_aead_encrypt_init(ctx->aead, ctx->seq++, aad, sizeof(aad));
    off += ptls_aead_encrypt_update(ctx->aead, ((uint8_t *)output) + off, input, inlen);
    off += ptls_aead_encrypt_update(ctx->aead, ((uint8_t *)output) + off, &content_type, 1);
    off += ptls_aead_encrypt_final(ctx->aead, ((uint8_t *)output) + off);

    return off;
}